

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_set_result(green_future_t future,void *p,int i)

{
  int lhs;
  green_poller_t poller;
  size_t sVar1;
  int iVar2;
  
  if (future == (green_future_t)0x0) {
    iVar2 = 1;
  }
  else {
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x25d);
      fflush(_stderr);
      abort();
    }
    if (future->state == green_future_aborted) {
      iVar2 = 4;
    }
    else if (future->state == green_future_complete) {
      iVar2 = 8;
    }
    else {
      (future->result).i = i;
      (future->result).p = p;
      future->state = green_future_complete;
      poller = future->poller;
      iVar2 = 0;
      if (poller != (green_poller_t)0x0) {
        lhs = future->slot;
        sVar1 = poller->busy - 1;
        poller->busy = sVar1;
        green_poller_swap(poller,lhs,(int)sVar1);
      }
    }
  }
  return iVar2;
}

Assistant:

int green_future_set_result(green_future_t future, void * p, int i)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);

    if (future->state == green_future_aborted) {
        return GREEN_ECANCELED;
    }
    if (future->state == green_future_complete) {
        return GREEN_EBADFD;
    }

    // Store result.
    future->result.i = i;
    future->result.p = p;

    // Mark as complete.
    future->state = green_future_complete;

    // Restore poller invariant.
    if (future->poller) {
        green_poller_swap(future->poller,
                          future->slot, --future->poller->busy);

        // TODO: resume coroutine blocked on poller, if any.
    }

    return GREEN_SUCCESS;
}